

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm128.c
# Opt level: O0

int CRYPTO_ccm128_decrypt(CCM128_CONTEXT *ctx,uchar *inp,uchar *out,size_t len)

{
  ulong uVar1;
  byte bVar2;
  ulong in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  byte *in_RDI;
  anon_union_16_2_94730053 scratch;
  void *key;
  block128_f block;
  uchar flags0;
  uint L;
  uint i;
  size_t n;
  ulong local_60;
  ulong local_58;
  undefined8 local_50;
  code *local_48;
  byte local_39;
  uint local_38;
  uint local_34;
  ulong local_30;
  ulong local_28;
  ulong *local_20;
  ulong *local_18;
  byte *local_10;
  int local_4;
  
  local_39 = *in_RDI;
  local_48 = *(code **)(in_RDI + 0x28);
  local_50 = *(undefined8 *)(in_RDI + 0x30);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((local_39 & 0x40) == 0) {
    (*local_48)(in_RDI,in_RDI + 0x10,local_50);
  }
  local_38 = local_39 & 7;
  *local_10 = (byte)local_38;
  local_30 = 0;
  for (local_34 = 0xf - local_38; local_34 < 0xf; local_34 = local_34 + 1) {
    bVar2 = local_10[local_34];
    local_10[local_34] = 0;
    local_30 = (bVar2 | local_30) << 8;
  }
  local_30 = local_10[0xf] | local_30;
  local_10[0xf] = 1;
  if (local_30 == local_28) {
    for (; 0xf < local_28; local_28 = local_28 - 0x10) {
      (*local_48)(local_10,&local_60,local_50);
      ctr64_inc(local_10);
      uVar1 = *local_18;
      *local_20 = local_60 ^ uVar1;
      *(ulong *)(local_10 + 0x10) = local_60 ^ uVar1 ^ *(ulong *)(local_10 + 0x10);
      uVar1 = local_18[1];
      local_20[1] = local_58 ^ uVar1;
      *(ulong *)(local_10 + 0x18) = local_58 ^ uVar1 ^ *(ulong *)(local_10 + 0x18);
      (*local_48)(local_10 + 0x10,local_10 + 0x10,local_50);
      local_18 = local_18 + 2;
      local_20 = local_20 + 2;
    }
    if (local_28 != 0) {
      (*local_48)(local_10,&local_60,local_50);
      for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
        bVar2 = *(byte *)((long)&local_60 + (ulong)local_34) ^
                *(byte *)((long)local_18 + (ulong)local_34);
        *(byte *)((long)local_20 + (ulong)local_34) = bVar2;
        local_10[(ulong)local_34 + 0x10] = local_10[(ulong)local_34 + 0x10] ^ bVar2;
      }
      (*local_48)(local_10 + 0x10,local_10 + 0x10,local_50);
    }
    for (local_34 = 0xf - local_38; local_34 < 0x10; local_34 = local_34 + 1) {
      local_10[local_34] = 0;
    }
    (*local_48)(local_10,&local_60,local_50);
    *(ulong *)(local_10 + 0x10) = local_60 ^ *(ulong *)(local_10 + 0x10);
    *(ulong *)(local_10 + 0x18) = local_58 ^ *(ulong *)(local_10 + 0x18);
    *local_10 = local_39;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CRYPTO_ccm128_decrypt(CCM128_CONTEXT *ctx,
                          const unsigned char *inp, unsigned char *out,
                          size_t len)
{
    size_t n;
    unsigned int i, L;
    unsigned char flags0 = ctx->nonce.c[0];
    block128_f block = ctx->block;
    void *key = ctx->key;
    union {
        u64 u[2];
        u8 c[16];
    } scratch;

    if (!(flags0 & 0x40))
        (*block) (ctx->nonce.c, ctx->cmac.c, key);

    ctx->nonce.c[0] = L = flags0 & 7;
    for (n = 0, i = 15 - L; i < 15; ++i) {
        n |= ctx->nonce.c[i];
        ctx->nonce.c[i] = 0;
        n <<= 8;
    }
    n |= ctx->nonce.c[15];      /* reconstructed length */
    ctx->nonce.c[15] = 1;

    if (n != len)
        return -1;

    while (len >= 16) {
#if defined(STRICT_ALIGNMENT)
        union {
            u64 u[2];
            u8 c[16];
        } temp;
#endif
        (*block) (ctx->nonce.c, scratch.c, key);
        ctr64_inc(ctx->nonce.c);
#if defined(STRICT_ALIGNMENT)
        memcpy(temp.c, inp, 16);
        ctx->cmac.u[0] ^= (scratch.u[0] ^= temp.u[0]);
        ctx->cmac.u[1] ^= (scratch.u[1] ^= temp.u[1]);
        memcpy(out, scratch.c, 16);
#else
        ctx->cmac.u[0] ^= (((u64_a1 *)out)[0]
                            = scratch.u[0] ^ ((u64_a1 *)inp)[0]);
        ctx->cmac.u[1] ^= (((u64_a1 *)out)[1]
                            = scratch.u[1] ^ ((u64_a1 *)inp)[1]);
#endif
        (*block) (ctx->cmac.c, ctx->cmac.c, key);

        inp += 16;
        out += 16;
        len -= 16;
    }

    if (len) {
        (*block) (ctx->nonce.c, scratch.c, key);
        for (i = 0; i < len; ++i)
            ctx->cmac.c[i] ^= (out[i] = scratch.c[i] ^ inp[i]);
        (*block) (ctx->cmac.c, ctx->cmac.c, key);
    }

    for (i = 15 - L; i < 16; ++i)
        ctx->nonce.c[i] = 0;

    (*block) (ctx->nonce.c, scratch.c, key);
    ctx->cmac.u[0] ^= scratch.u[0];
    ctx->cmac.u[1] ^= scratch.u[1];

    ctx->nonce.c[0] = flags0;

    return 0;
}